

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_>::check_done
          (basic_json_reader<char,_jsoncons::stream_source<char>,_std::allocator<char>_> *this,
          error_code *ec)

{
  uint uVar1;
  int iVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  char_type *pcVar4;
  span<const_char,_18446744073709551615UL> sVar5;
  
  pbVar3 = (this->source_).source_.stream_ptr_;
  uVar1 = *(uint *)(&pbVar3->field_0x20 + (long)pbVar3->_vptr_basic_istream[-3]);
  if ((uVar1 & 1) != 0) {
    std::error_code::operator=(ec,source_error);
    return;
  }
  if (((uVar1 & 2) != 0) && ((this->source_).source_.buffer_length_ == 0)) {
    basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec);
    return;
  }
  do {
    if ((this->parser_).input_ptr_ == (this->parser_).end_input_) {
      sVar5 = json_source_adaptor<jsoncons::stream_source<char>_>::read_buffer(&this->source_,ec);
      pcVar4 = sVar5.data_;
      iVar2 = ec->_M_value;
      if (sVar5.size_ != 0 && iVar2 == 0) {
        (this->parser_).begin_input_ = pcVar4;
        (this->parser_).end_input_ = pcVar4 + sVar5.size_;
        (this->parser_).input_ptr_ = pcVar4;
      }
      if (iVar2 != 0) {
        return;
      }
    }
    if (((this->parser_).input_ptr_ != (this->parser_).end_input_) &&
       (basic_json_parser<char,_std::allocator<char>_>::check_done(&this->parser_,ec),
       ec->_M_value != 0)) {
      return;
    }
  } while ((((this->parser_).input_ptr_ != (this->parser_).end_input_) ||
           ((this->source_).source_.buffer_length_ != 0)) ||
          (pbVar3 = (this->source_).source_.stream_ptr_,
          ((&pbVar3->field_0x20)[(long)pbVar3->_vptr_basic_istream[-3]] & 2) == 0));
  return;
}

Assistant:

void check_done(std::error_code& ec)
        {
            if (source_.is_error())
            {
                ec = json_errc::source_error;
                return;
            }   
            if (source_.eof())
            {
                parser_.check_done(ec);
                if (JSONCONS_UNLIKELY(ec)) return;
            }
            else
            {
                do
                {
                    if (parser_.source_exhausted())
                    {
                        auto s = source_.read_buffer(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                        if (s.size() > 0)
                        {
                            parser_.update(s.data(),s.size());
                        }
                    }
                    if (!parser_.source_exhausted())
                    {
                        parser_.check_done(ec);
                        if (JSONCONS_UNLIKELY(ec)) return;
                    }
                }
                while (!eof());
            }
        }